

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

pool_ptr<soul::AST::Namespace> __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::findParameterisedNamespace
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi,int *itemsRemoved)

{
  pool_ref<soul::AST::ASTObject> *ppVar1;
  Namespace *pNVar2;
  int *in_RCX;
  pool_ref<soul::AST::ASTObject> local_1c8;
  NameSearch local_1c0;
  string p;
  IdentifierPath path;
  pool_ptr<soul::AST::Namespace> n;
  
  *in_RCX = 1;
  AST::QualifiedIdentifier::getPath
            ((IdentifierPath *)&local_1c0,(QualifiedIdentifier *)itemsRemoved);
  IdentifierPath::getParentPath(&path,(IdentifierPath *)&local_1c0);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&local_1c0);
  IdentifierPath::toString_abi_cxx11_(&p,&path);
  do {
    if (path.pathSections.numActive == 0) {
      (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
      super_RewritingASTVisitor._vptr_RewritingASTVisitor = (_func_int **)0x0;
LAB_002426a1:
      std::__cxx11::string::~string((string *)&p);
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&path.pathSections);
      return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
    }
    local_1c0.itemsFound.numActive = 0;
    local_1c0.itemsFound.numAllocated = 8;
    local_1c0.partiallyQualifiedPath.pathSections.items =
         (Identifier *)local_1c0.partiallyQualifiedPath.pathSections.space;
    local_1c0.partiallyQualifiedPath.pathSections.numActive = 0;
    local_1c0.partiallyQualifiedPath.pathSections.numAllocated = 8;
    local_1c0.stopAtFirstScopeWithResults = false;
    local_1c0.requiredNumFunctionArgs = -1;
    local_1c0.findVariables = true;
    local_1c0.findTypes = true;
    local_1c0.findFunctions = true;
    local_1c0.findNamespaces = true;
    local_1c0.findProcessors = true;
    local_1c0.findProcessorInstances = false;
    local_1c0.findEndpoints = true;
    local_1c0.onlyFindLocalVariables = false;
    local_1c0.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_1c0.itemsFound.space;
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
              (&local_1c0.partiallyQualifiedPath.pathSections,&path.pathSections);
    local_1c0.stopAtFirstScopeWithResults = true;
    local_1c0.findVariables = false;
    local_1c0.findTypes = false;
    local_1c0.findFunctions = false;
    local_1c0.findNamespaces = true;
    local_1c0.findProcessors = false;
    local_1c0.findProcessorInstances = false;
    local_1c0.findEndpoints = false;
    if (*(Scope **)(itemsRemoved + 8) != (Scope *)0x0) {
      AST::Scope::performFullNameSearch
                (*(Scope **)(itemsRemoved + 8),&local_1c0,
                 (Statement *)
                 (qi->pathSections).
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_1c0.itemsFound.numActive != 0) {
      ppVar1 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                         (&local_1c0.itemsFound);
      local_1c8.object = ppVar1->object;
      cast<soul::AST::Namespace,soul::AST::ASTObject>((soul *)&n,&local_1c8);
      if (n.object != (Namespace *)0x0) {
        pNVar2 = pool_ptr<soul::AST::Namespace>::operator->(&n);
        if ((pNVar2->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (pNVar2->super_ModuleBase).specialisationParams.
            super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          n.object = (Namespace *)0x0;
        }
        (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
        super_RewritingASTVisitor._vptr_RewritingASTVisitor = (_func_int **)n.object;
        AST::Scope::NameSearch::~NameSearch(&local_1c0);
        goto LAB_002426a1;
      }
    }
    IdentifierPath::getParentPath((IdentifierPath *)&n,(IdentifierPath *)&path.pathSections);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
              (&path.pathSections,(ArrayWithPreallocation<soul::Identifier,_8UL> *)&n);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear
              ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&n);
    *in_RCX = *in_RCX + 1;
    AST::Scope::NameSearch::~NameSearch(&local_1c0);
  } while( true );
}

Assistant:

pool_ptr<AST::Namespace> findParameterisedNamespace (AST::QualifiedIdentifier& qi, int& itemsRemoved)
        {
            itemsRemoved = 1;
            auto path = qi.getPath().getParentPath();
            auto p = path.toString();

            while (! path.empty())
            {
                AST::Scope::NameSearch search;
                search.partiallyQualifiedPath = path;
                search.stopAtFirstScopeWithResults = true;
                search.findVariables = false;
                search.findTypes = false;
                search.findFunctions = false;
                search.findNamespaces = true;
                search.findProcessors = false;
                search.findProcessorInstances = false;
                search.findEndpoints = false;

                if (auto scope = qi.getParentScope())
                    scope->performFullNameSearch (search, currentStatement.get());

                if (search.itemsFound.size() != 0)
                {
                    auto item = search.itemsFound.front();

                    if (auto n = cast<AST::Namespace> (item))
                    {
                        if (n->isTemplateModule())
                            return n;

                        return {};
                    }
                }

                path = path.getParentPath();
                itemsRemoved++;
            }

            return {};
        }